

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

PendingComponent * __thiscall
cmComputeLinkDepends::MakePendingComponent(cmComputeLinkDepends *this,size_t component)

{
  reference __k;
  mapped_type *pmVar1;
  pointer this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  size_type sVar2;
  size_t sVar3;
  const_iterator __first;
  const_iterator __last;
  NodeList *nl;
  PendingComponent *pc;
  size_t component_local;
  cmComputeLinkDepends *this_local;
  
  __k = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (&this->ComponentOrder,component);
  pmVar1 = std::
           map<unsigned_long,_cmComputeLinkDepends::PendingComponent,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cmComputeLinkDepends::PendingComponent>_>_>
           ::operator[](&this->PendingComponents,__k);
  pmVar1->Id = component;
  this_00 = std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
            ::operator->(&this->CCG);
  this_01 = &cmComputeComponentGraph::GetComponent(this_00,component)->
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_01);
  if (sVar2 == 1) {
    pmVar1->Count = 1;
  }
  else {
    sVar3 = ComputeComponentCount(this,(NodeList *)this_01);
    pmVar1->Count = sVar3;
  }
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_01);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_01);
  std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)
             &pmVar1->Entries,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current);
  return pmVar1;
}

Assistant:

cmComputeLinkDepends::PendingComponent&
cmComputeLinkDepends::MakePendingComponent(size_t component)
{
  // Create an entry (in topological order) for the component.
  PendingComponent& pc =
    this->PendingComponents[this->ComponentOrder[component]];
  pc.Id = component;
  NodeList const& nl = this->CCG->GetComponent(component);

  if (nl.size() == 1) {
    // Trivial components need be seen only once.
    pc.Count = 1;
  } else {
    // This is a non-trivial strongly connected component of the
    // original graph.  It consists of two or more libraries
    // (archives) that mutually require objects from one another.  In
    // the worst case we may have to repeat the list of libraries as
    // many times as there are object files in the biggest archive.
    // For now we just list them twice.
    //
    // The list of items in the component has been sorted by the order
    // of discovery in the original BFS of dependencies.  This has the
    // advantage that the item directly linked by a target requiring
    // this component will come first which minimizes the number of
    // repeats needed.
    pc.Count = this->ComputeComponentCount(nl);
  }

  // Store the entries to be seen.
  pc.Entries.insert(nl.begin(), nl.end());

  return pc;
}